

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_sse2.h
# Opt level: O2

void VP8L32bToPlanar_SSE2(__m128i *in0,__m128i *in1,__m128i *in2,__m128i *in3)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined1 uVar22;
  undefined1 uVar23;
  undefined1 uVar24;
  undefined1 uVar25;
  undefined1 uVar26;
  undefined1 uVar27;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined1 uVar30;
  undefined1 uVar31;
  undefined1 uVar32;
  undefined1 uVar33;
  undefined1 uVar34;
  undefined1 uVar35;
  undefined1 uVar36;
  undefined1 uVar37;
  undefined1 uVar38;
  undefined1 uVar39;
  undefined1 uVar40;
  undefined1 uVar41;
  undefined1 uVar42;
  undefined1 uVar43;
  undefined1 uVar44;
  undefined1 uVar45;
  undefined1 uVar46;
  undefined1 uVar47;
  undefined1 uVar48;
  undefined1 uVar49;
  undefined1 uVar50;
  undefined1 uVar51;
  undefined1 uVar52;
  longlong lVar53;
  longlong lVar54;
  longlong lVar55;
  longlong lVar56;
  longlong lVar57;
  longlong lVar58;
  longlong lVar59;
  longlong lVar60;
  
  lVar53 = (*in0)[0];
  uVar29 = *(undefined1 *)((long)*in0 + 1);
  uVar30 = *(undefined1 *)((long)*in0 + 2);
  uVar31 = *(undefined1 *)((long)*in0 + 4);
  uVar32 = *(undefined1 *)((long)*in0 + 5);
  uVar33 = *(undefined1 *)((long)*in0 + 6);
  lVar54 = (*in0)[1];
  uVar34 = *(undefined1 *)((long)*in0 + 9);
  uVar35 = *(undefined1 *)((long)*in0 + 10);
  uVar36 = *(undefined1 *)((long)*in0 + 0xc);
  uVar37 = *(undefined1 *)((long)*in0 + 0xd);
  uVar38 = *(undefined1 *)((long)*in0 + 0xe);
  lVar55 = (*in1)[0];
  uVar1 = *(undefined1 *)((long)*in1 + 1);
  uVar2 = *(undefined1 *)((long)*in1 + 2);
  uVar3 = *(undefined1 *)((long)*in1 + 3);
  uVar4 = *(undefined1 *)((long)*in1 + 4);
  uVar5 = *(undefined1 *)((long)*in1 + 5);
  uVar6 = *(undefined1 *)((long)*in1 + 6);
  uVar7 = *(undefined1 *)((long)*in1 + 7);
  lVar56 = (*in1)[1];
  uVar8 = *(undefined1 *)((long)*in1 + 9);
  uVar9 = *(undefined1 *)((long)*in1 + 10);
  uVar10 = *(undefined1 *)((long)*in1 + 0xb);
  uVar11 = *(undefined1 *)((long)*in1 + 0xc);
  uVar12 = *(undefined1 *)((long)*in1 + 0xd);
  uVar13 = *(undefined1 *)((long)*in1 + 0xe);
  uVar14 = *(undefined1 *)((long)*in1 + 0xf);
  lVar57 = (*in2)[0];
  uVar39 = *(undefined1 *)((long)*in2 + 1);
  uVar40 = *(undefined1 *)((long)*in2 + 2);
  uVar41 = *(undefined1 *)((long)*in2 + 3);
  uVar42 = *(undefined1 *)((long)*in2 + 4);
  uVar43 = *(undefined1 *)((long)*in2 + 5);
  uVar44 = *(undefined1 *)((long)*in2 + 6);
  uVar45 = *(undefined1 *)((long)*in2 + 7);
  lVar58 = (*in2)[1];
  uVar46 = *(undefined1 *)((long)*in2 + 9);
  uVar47 = *(undefined1 *)((long)*in2 + 10);
  uVar48 = *(undefined1 *)((long)*in2 + 0xb);
  uVar49 = *(undefined1 *)((long)*in2 + 0xc);
  uVar50 = *(undefined1 *)((long)*in2 + 0xd);
  uVar51 = *(undefined1 *)((long)*in2 + 0xe);
  uVar52 = *(undefined1 *)((long)*in2 + 0xf);
  lVar59 = (*in3)[0];
  uVar15 = *(undefined1 *)((long)*in3 + 1);
  uVar16 = *(undefined1 *)((long)*in3 + 2);
  uVar17 = *(undefined1 *)((long)*in3 + 3);
  uVar18 = *(undefined1 *)((long)*in3 + 4);
  uVar19 = *(undefined1 *)((long)*in3 + 5);
  uVar20 = *(undefined1 *)((long)*in3 + 6);
  uVar21 = *(undefined1 *)((long)*in3 + 7);
  lVar60 = (*in3)[1];
  uVar22 = *(undefined1 *)((long)*in3 + 9);
  uVar23 = *(undefined1 *)((long)*in3 + 10);
  uVar24 = *(undefined1 *)((long)*in3 + 0xb);
  uVar25 = *(undefined1 *)((long)*in3 + 0xc);
  uVar26 = *(undefined1 *)((long)*in3 + 0xd);
  uVar27 = *(undefined1 *)((long)*in3 + 0xe);
  uVar28 = *(undefined1 *)((long)*in3 + 0xf);
  *(undefined1 *)(*in0 + 1) = *(undefined1 *)((long)*in0 + 3);
  *(undefined1 *)((long)*in0 + 9) = *(undefined1 *)((long)*in0 + 7);
  *(undefined1 *)((long)*in0 + 10) = *(undefined1 *)((long)*in0 + 0xb);
  *(undefined1 *)((long)*in0 + 0xb) = *(undefined1 *)((long)*in0 + 0xf);
  *(undefined1 *)((long)*in0 + 0xc) = uVar3;
  *(undefined1 *)((long)*in0 + 0xd) = uVar7;
  *(undefined1 *)((long)*in0 + 0xe) = uVar10;
  *(undefined1 *)((long)*in0 + 0xf) = uVar14;
  *(undefined1 *)in0[1] = uVar41;
  *(undefined1 *)((long)in0[1] + 1) = uVar45;
  *(undefined1 *)((long)in0[1] + 2) = uVar48;
  *(undefined1 *)((long)in0[1] + 3) = uVar52;
  *(undefined1 *)((long)in0[1] + 4) = uVar17;
  *(undefined1 *)((long)in0[1] + 5) = uVar21;
  *(undefined1 *)((long)in0[1] + 6) = uVar24;
  *(undefined1 *)((long)in0[1] + 7) = uVar28;
  *(undefined1 *)*in1 = uVar30;
  *(undefined1 *)((long)*in1 + 1) = uVar33;
  *(undefined1 *)((long)*in1 + 2) = uVar35;
  *(undefined1 *)((long)*in1 + 3) = uVar38;
  *(undefined1 *)((long)*in1 + 4) = uVar2;
  *(undefined1 *)((long)*in1 + 5) = uVar6;
  *(undefined1 *)((long)*in1 + 6) = uVar9;
  *(undefined1 *)((long)*in1 + 7) = uVar13;
  *(undefined1 *)(*in1 + 1) = uVar40;
  *(undefined1 *)((long)*in1 + 9) = uVar44;
  *(undefined1 *)((long)*in1 + 10) = uVar47;
  *(undefined1 *)((long)*in1 + 0xb) = uVar51;
  *(undefined1 *)((long)*in1 + 0xc) = uVar16;
  *(undefined1 *)((long)*in1 + 0xd) = uVar20;
  *(undefined1 *)((long)*in1 + 0xe) = uVar23;
  *(undefined1 *)((long)*in1 + 0xf) = uVar27;
  *(undefined1 *)(*in2 + 1) = uVar29;
  *(undefined1 *)((long)*in2 + 9) = uVar32;
  *(undefined1 *)((long)*in2 + 10) = uVar34;
  *(undefined1 *)((long)*in2 + 0xb) = uVar37;
  *(undefined1 *)((long)*in2 + 0xc) = uVar1;
  *(undefined1 *)((long)*in2 + 0xd) = uVar5;
  *(undefined1 *)((long)*in2 + 0xe) = uVar8;
  *(undefined1 *)((long)*in2 + 0xf) = uVar12;
  *(undefined1 *)in2[1] = uVar39;
  *(undefined1 *)((long)in2[1] + 1) = uVar43;
  *(undefined1 *)((long)in2[1] + 2) = uVar46;
  *(undefined1 *)((long)in2[1] + 3) = uVar50;
  *(undefined1 *)((long)in2[1] + 4) = uVar15;
  *(undefined1 *)((long)in2[1] + 5) = uVar19;
  *(undefined1 *)((long)in2[1] + 6) = uVar22;
  *(undefined1 *)((long)in2[1] + 7) = uVar26;
  *(char *)*in3 = (char)lVar53;
  *(undefined1 *)((long)*in3 + 1) = uVar31;
  *(char *)((long)*in3 + 2) = (char)lVar54;
  *(undefined1 *)((long)*in3 + 3) = uVar36;
  *(char *)((long)*in3 + 4) = (char)lVar55;
  *(undefined1 *)((long)*in3 + 5) = uVar4;
  *(char *)((long)*in3 + 6) = (char)lVar56;
  *(undefined1 *)((long)*in3 + 7) = uVar11;
  *(char *)(*in3 + 1) = (char)lVar57;
  *(undefined1 *)((long)*in3 + 9) = uVar42;
  *(char *)((long)*in3 + 10) = (char)lVar58;
  *(undefined1 *)((long)*in3 + 0xb) = uVar49;
  *(char *)((long)*in3 + 0xc) = (char)lVar59;
  *(undefined1 *)((long)*in3 + 0xd) = uVar18;
  *(char *)((long)*in3 + 0xe) = (char)lVar60;
  *(undefined1 *)((long)*in3 + 0xf) = uVar25;
  return;
}

Assistant:

static WEBP_INLINE void VP8L32bToPlanar_SSE2(__m128i* const in0,
                                             __m128i* const in1,
                                             __m128i* const in2,
                                             __m128i* const in3) {
  // Column-wise transpose.
  const __m128i A0 = _mm_unpacklo_epi8(*in0, *in1);
  const __m128i A1 = _mm_unpackhi_epi8(*in0, *in1);
  const __m128i A2 = _mm_unpacklo_epi8(*in2, *in3);
  const __m128i A3 = _mm_unpackhi_epi8(*in2, *in3);
  const __m128i B0 = _mm_unpacklo_epi8(A0, A1);
  const __m128i B1 = _mm_unpackhi_epi8(A0, A1);
  const __m128i B2 = _mm_unpacklo_epi8(A2, A3);
  const __m128i B3 = _mm_unpackhi_epi8(A2, A3);
  // C0 = g7 g6 ... g1 g0 | b7 b6 ... b1 b0
  // C1 = a7 a6 ... a1 a0 | r7 r6 ... r1 r0
  const __m128i C0 = _mm_unpacklo_epi8(B0, B1);
  const __m128i C1 = _mm_unpackhi_epi8(B0, B1);
  const __m128i C2 = _mm_unpacklo_epi8(B2, B3);
  const __m128i C3 = _mm_unpackhi_epi8(B2, B3);
  // Gather the channels.
  *in0 = _mm_unpackhi_epi64(C1, C3);
  *in1 = _mm_unpacklo_epi64(C1, C3);
  *in2 = _mm_unpackhi_epi64(C0, C2);
  *in3 = _mm_unpacklo_epi64(C0, C2);
}